

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# H18_stack.c
# Opt level: O1

int main(void)

{
  double *pdVar1;
  uint uVar2;
  int iVar3;
  bool bVar4;
  double dVar5;
  
  pdVar1 = (double *)malloc(0x18);
  if (0 < i) {
    i = i - 1;
    *pdVar1 = stack[(uint)i];
    __assert_fail("pop(p) == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/yahooshiken[P]in-c/H18_stack.c"
                  ,0x23,"int main()");
  }
  if ((long)i < 100) {
    stack[i] = 1.0;
    iVar3 = i + 1;
    bVar4 = i == 0;
    i = iVar3;
    if (bVar4) {
      if (99 < (long)iVar3) {
        puts("Over");
        __assert_fail("push(2.0) == 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/yahooshiken[P]in-c/H18_stack.c"
                      ,0x26,"int main()");
      }
      stack[iVar3] = 2.0;
      i = 2;
      stack[2] = 3.0;
      *pdVar1 = 3.0;
      if (0 < i) {
        uVar2 = i - 1;
        i = uVar2;
        pdVar1[1] = stack[uVar2];
        if (uVar2 == 1) {
          if (0 < i) {
            i = i - 1;
            bVar4 = i == 0;
            pdVar1[2] = stack[(uint)i];
            if (bVar4) {
              if ((*pdVar1 != 3.0) || (NAN(*pdVar1))) {
                __assert_fail("*p == 3.0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/yahooshiken[P]in-c/H18_stack.c"
                              ,0x2d,"int main()");
              }
              if ((pdVar1[1] == 2.0) && (!NAN(pdVar1[1]))) {
                if ((pdVar1[2] == 1.0) && (!NAN(pdVar1[2]))) {
                  dVar5 = 0.0;
                  iVar3 = 100;
                  do {
                    if ((long)i < 100) {
                      stack[i] = dVar5;
                      i = i + 1;
                    }
                    else {
                      puts("Over");
                    }
                    dVar5 = dVar5 + 1.0;
                    iVar3 = iVar3 + -1;
                  } while (iVar3 != 0);
                  if ((long)i < 100) {
                    stack[i] = 1.0;
                    i = i + 1;
                    if (i != -1) {
                      __assert_fail("push(1.0) == -1",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/yahooshiken[P]in-c/H18_stack.c"
                                    ,0x35,"int main()");
                    }
                  }
                  else {
                    puts("Over");
                  }
                  return 0;
                }
                __assert_fail("*(p + 2) == 1.0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/yahooshiken[P]in-c/H18_stack.c"
                              ,0x2f,"int main()");
              }
              __assert_fail("*(p + 1) == 2.0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/yahooshiken[P]in-c/H18_stack.c"
                            ,0x2e,"int main()");
            }
          }
          __assert_fail("pop(p + 2) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/yahooshiken[P]in-c/H18_stack.c"
                        ,0x2b,"int main()");
        }
      }
      __assert_fail("pop(p + 1) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/yahooshiken[P]in-c/H18_stack.c"
                    ,0x2a,"int main()");
    }
  }
  else {
    puts("Over");
  }
  __assert_fail("push(1.0) == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/yahooshiken[P]in-c/H18_stack.c"
                ,0x25,"int main()");
}

Assistant:

int main() {
  double *p = (double *)malloc(sizeof(double) * 3);

  assert(pop(p) == -1);

  assert(push(1.0) == 1);
  assert(push(2.0) == 2);
  assert(push(3.0) == 3);

  assert(pop(p) == 2);
  assert(pop(p + 1) == 1);
  assert(pop(p + 2) == 0);

  assert(*p == 3.0);
  assert(*(p + 1) == 2.0);
  assert(*(p + 2) == 1.0);

  for (int i = 0; i < STACKSIZE; i++) {
    push((double)i);
  }

  assert(push(1.0) == -1);
}